

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O3

bool __thiscall optimization::common_expr_del::BlockNodes::exportNode(BlockNodes *this,uint32_t idx)

{
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  _Rb_tree_header *p_Var3;
  _Rb_tree_color _Var4;
  byte bVar5;
  byte bVar6;
  _Base_ptr p_Var7;
  _List_node_base *p_Var8;
  mapped_type_conflict *pmVar9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  _Rb_tree_header *p_Var12;
  bool bVar13;
  set<optimization::common_expr_del::NodeId,_std::less<optimization::common_expr_del::NodeId>,_std::allocator<optimization::common_expr_del::NodeId>_>
  parents;
  uint32_t local_64;
  _Rb_tree<optimization::common_expr_del::NodeId,_optimization::common_expr_del::NodeId,_std::_Identity<optimization::common_expr_del::NodeId>,_std::less<optimization::common_expr_del::NodeId>,_std::allocator<optimization::common_expr_del::NodeId>_>
  local_60;
  
  p_Var7 = (this->added)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->added)._M_t._M_impl.super__Rb_tree_header;
  p_Var10 = &p_Var1->_M_header;
  if (p_Var7 != (_Base_ptr)0x0) {
    do {
      bVar13 = p_Var7[1]._M_color < idx;
      if (!bVar13) {
        p_Var10 = p_Var7;
      }
      p_Var7 = (&p_Var7->_M_left)[bVar13];
    } while (p_Var7 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var10 != p_Var1) && (p_Var10[1]._M_color <= idx)) {
      return false;
    }
  }
  local_64 = idx;
  std::
  _Rb_tree<optimization::common_expr_del::NodeId,_optimization::common_expr_del::NodeId,_std::_Identity<optimization::common_expr_del::NodeId>,_std::less<optimization::common_expr_del::NodeId>,_std::allocator<optimization::common_expr_del::NodeId>_>
  ::_Rb_tree(&local_60,
             &(((this->nodes).
                super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                ._M_impl.super__Vector_impl_data._M_start[idx].
                super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->parents)._M_t);
  p_Var3 = &local_60._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var3) {
    p_Var7 = (this->added)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    bVar6 = 0;
    do {
      bVar5 = bVar6;
      p_Var12 = p_Var1;
      if (p_Var7 != (_Base_ptr)0x0) {
        _Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color;
        p_Var11 = &p_Var1->_M_header;
        p_Var10 = p_Var7;
        do {
          bVar13 = (_Rb_tree_color)*(size_t *)(p_Var10 + 1) < _Var4;
          if (!bVar13) {
            p_Var11 = p_Var10;
          }
          p_Var10 = (&p_Var10->_M_left)[bVar13];
        } while (p_Var10 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
           (p_Var12 = (_Rb_tree_header *)p_Var11,
           _Var4 < (_Rb_tree_color)((_Rb_tree_header *)p_Var11)->_M_node_count)) {
          p_Var12 = p_Var1;
        }
      }
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)
           std::_Rb_tree_increment(local_60._M_impl.super__Rb_tree_header._M_header._M_left);
      bVar6 = bVar5 | p_Var12 == p_Var1;
    } while ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var3);
    if ((bool)(bVar5 | p_Var12 == p_Var1)) {
      bVar13 = false;
      goto LAB_0012e4cb;
    }
  }
  p_Var8 = (_List_node_base *)operator_new(0x18);
  *(uint32_t *)&p_Var8[1]._M_next = idx;
  std::__detail::_List_node_base::_M_hook(p_Var8);
  psVar2 = &(this->exportQueue).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl._M_node._M_size;
  *psVar2 = *psVar2 + 1;
  pmVar9 = std::
           map<unsigned_int,_bool,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
           ::operator[](&this->added,&local_64);
  *pmVar9 = true;
  bVar13 = true;
LAB_0012e4cb:
  std::
  _Rb_tree<optimization::common_expr_del::NodeId,_optimization::common_expr_del::NodeId,_std::_Identity<optimization::common_expr_del::NodeId>,_std::less<optimization::common_expr_del::NodeId>,_std::allocator<optimization::common_expr_del::NodeId>_>
  ::~_Rb_tree(&local_60);
  return bVar13;
}

Assistant:

bool exportNode(uint32_t idx) {
    if (added.count(idx)) {
      return false;
    }
    bool flag = false;
    auto parents = nodes[idx]->parents;
    for (auto nodeId : parents) {
      if (!added.count(nodeId.id)) {
        flag = true;
      }
    }
    if (flag) {
      return false;
    }
    exportQueue.push_back(idx);
    added[idx] = true;
    // for (auto operand : nodes[idx]->operands) {
    //   if (operand.index() == 1) {
    //     auto nodeId = std::get<NodeId>(operand);
    //     exportNode(nodeId.id);
    //     break;
    //   }
    // }
    return true;
  }